

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>
               (void)

{
  Column_support *pCVar1;
  uint uVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  _Bit_type *p_Var5;
  node_ptr *pplVar6;
  pointer puVar7;
  pointer puVar8;
  undefined4 **ppuVar9;
  bool bVar10;
  node_ptr to_insert;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
  *__v;
  long lVar11;
  const_node_ptr p;
  node_ptr plVar12;
  uint uVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  node_ptr plVar14;
  _Bit_type *p_Var15;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  vector<bool,_std::allocator<bool>_> container;
  undefined4 local_26c;
  vector<bool,_std::allocator<bool>_> veccont;
  undefined **local_240;
  ulong local_238;
  shared_count sStack_230;
  char *local_228;
  Column_settings settings;
  char *local_218;
  char *local_210;
  shared_count sStack_208;
  undefined8 local_200;
  undefined4 *local_1f8;
  undefined8 *local_1f0;
  undefined **local_1e8;
  ulong uStack_1e0;
  undefined8 *local_1d8;
  char **local_1d0;
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
  col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  undefined4 **local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_1e8 = (undefined **)0x100000000;
  uStack_1e0 = 0x500000002;
  local_1d8 = (undefined8 *)CONCAT44(local_1d8._4_4_,6);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_1e8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&container,__l,
             (allocator_type *)&local_240);
  pCVar1 = &col.column_;
  col.super_Row_access_option.columnIndex_ = 0xffffffff;
  col.super_Row_access_option.rows_ = (Row_container *)0x0;
  col.operators_ = (Field_operators *)0x0;
  col.entryPool_ = (Entry_constructor *)&settings;
  p_Var5 = (_Bit_type *)
           CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                    container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar1;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar1;
  for (p_Var15 = container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p; p_Var15 != p_Var5;
      p_Var15 = (_Bit_type *)((long)p_Var15 + 4)) {
    uVar13 = (uint)*p_Var15;
    __v = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
           *)operator_new(0x20);
    (__v->super_Entry_column_index_option).columnIndex_ = col.super_Row_access_option.columnIndex_;
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    __v->rowIndex_ = uVar13;
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
         col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)pCVar1;
    pplVar6 = &(col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_)->next_;
    col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&__v->super_Column_hook;
    *pplVar6 = (node_ptr)&__v->super_Column_hook;
    if (col.super_Row_access_option.rows_ != (Row_container *)0x0) {
      if ((ulong)(((long)((col.super_Row_access_option.rows_)->
                         super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)((col.super_Row_access_option.rows_)->
                         super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <
          (ulong)(uVar13 + 1)) {
        std::
        vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
        ::resize(col.super_Row_access_option.rows_,(ulong)(uVar13 + 1));
      }
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>>
      ::
      _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>const&>
                ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>>
                  *)(((col.super_Row_access_option.rows_)->
                     super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar13),__v);
    }
  }
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                             container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_)
                    - (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,
                0x1010000010101);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&container);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x290);
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    lVar11 = 1;
    plVar12 = (node_ptr)pCVar1;
    do {
      plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
      lVar11 = lVar11 + -1;
    } while (plVar12 != (node_ptr)pCVar1);
    if (lVar11 != 0) {
      uVar13 = *(int *)&col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_[1].
                        next_ + 1;
      goto LAB_001b22ef;
    }
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_001b22ef:
    local_1e8 = (undefined **)((ulong)local_1e8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&container,(long)(int)uVar13,(bool *)&local_1e8,(allocator_type *)&local_218);
    for (plVar12 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
        (plVar12 != (node_ptr)pCVar1 && (uVar2 = *(uint *)&plVar12[1].next_, uVar2 < uVar13));
        plVar12 = plVar12->next_) {
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p[uVar2 >> 6] =
           container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
    }
  }
  __last1.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((ulong)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar10 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1,__last1,__first2);
  }
  else {
    bVar10 = false;
  }
  local_240 = (undefined **)CONCAT71(local_240._1_7_,bVar10);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_1d0 = &local_218;
  local_218 = "col.get_content(veccont.size()) == veccont";
  local_210 = "";
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e388;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&local_240,&local_1e8,&local_60,0x290,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_230);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x291);
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_0020e440;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_1f8 = (undefined4 *)0xffffffffffffffff;
  plVar12 = (node_ptr)pCVar1;
  do {
    plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_1f8 = (undefined4 *)((long)local_1f8 + 1);
  } while (plVar12 != (node_ptr)pCVar1);
  local_180 = &local_1f8;
  local_1f0 = &local_200;
  local_200 = CONCAT44(local_200._4_4_,5);
  local_218 = (char *)CONCAT71(local_218._1_7_,local_1f8 == (undefined4 *)0x5);
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c260b;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1d0d0f;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_180;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0020e400;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x216120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  local_1d0 = (char **)&local_1f0;
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e6c0;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_240,&permutation,0x291,1,2,2,"col.size()",&container,"5",&local_1e8);
  boost::detail::shared_count::~shared_count(&sStack_208);
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 1;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 4;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 6;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x500000000;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 2;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 3;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)&container;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&permutation,__l_00,(allocator_type *)&local_1e8);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>
  ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>
              *)&col,&permutation,0xffffffff);
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,
                0x1010100010001);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&container);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x296);
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    lVar11 = 1;
    plVar12 = (node_ptr)pCVar1;
    do {
      plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
      lVar11 = lVar11 + -1;
    } while (plVar12 != (node_ptr)pCVar1);
    if (lVar11 != 0) {
      uVar13 = *(int *)&col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_[1].
                        next_ + 1;
      goto LAB_001b26b1;
    }
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_001b26b1:
    local_1e8 = (undefined **)((ulong)local_1e8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&container,(long)(int)uVar13,(bool *)&local_1e8,(allocator_type *)&local_218);
    for (plVar12 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
        (plVar12 != (node_ptr)pCVar1 && (uVar2 = *(uint *)&plVar12[1].next_, uVar2 < uVar13));
        plVar12 = plVar12->next_) {
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p[uVar2 >> 6] =
           container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1_00.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((ulong)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar10 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar10 = false;
  }
  local_240 = (undefined **)CONCAT71(local_240._1_7_,bVar10);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_218 = "col.get_content(veccont.size()) == veccont";
  local_210 = "";
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e388;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_1d0 = &local_218;
  boost::test_tools::tt_detail::report_assertion(&local_240,&local_1e8,&local_b0,0x296,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_230);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x297);
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_0020e440;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_200 = -1;
  plVar12 = (node_ptr)pCVar1;
  do {
    plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_200 = local_200 + 1;
  } while (plVar12 != (node_ptr)pCVar1);
  local_1f8 = &local_26c;
  local_26c = 5;
  local_218 = (char *)CONCAT71(local_218._1_7_,local_200 == 5);
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1d0c9c;
  local_178 = "";
  local_1f0 = &local_200;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0020e400;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x216120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_1f0;
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e6c0;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = (char **)&local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_240,&local_180,0x297,1,2,2,"col.size()",&container,"5",&local_1e8);
  boost::detail::shared_count::~shared_count(&sStack_208);
  plVar12 = (node_ptr)pCVar1;
  do {
    plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar14 = (node_ptr)pCVar1;
    if (plVar12 == (node_ptr)pCVar1) goto LAB_001b29cf;
  } while (*(int *)&plVar12[1].next_ != 2);
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&col;
  plVar3 = plVar12->next_;
  plVar4 = plVar12->prev_;
  plVar4->next_ = plVar3;
  plVar3->prev_ = plVar4;
  plVar12->next_ = (node_ptr)0x0;
  plVar12->prev_ = (node_ptr)0x0;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
  ::Delete_disposer::operator()((Delete_disposer *)&container,(Entry *)&plVar12[-1].prev_);
LAB_001b29cf:
  do {
    plVar14 = (((type *)&plVar14->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar14 == (node_ptr)pCVar1) goto LAB_001b2a08;
  } while (*(int *)&plVar14[1].next_ != 6);
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&col;
  plVar12 = plVar14->next_;
  plVar3 = plVar14->prev_;
  plVar3->next_ = plVar12;
  plVar12->prev_ = plVar3;
  plVar14->next_ = (node_ptr)0x0;
  plVar14->prev_ = (node_ptr)0x0;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
  ::Delete_disposer::operator()((Delete_disposer *)&container,(Entry *)&plVar14[-1].prev_);
LAB_001b2a08:
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,0x10100000001)
  ;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&container);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x29c);
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    lVar11 = 1;
    plVar12 = (node_ptr)pCVar1;
    do {
      plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
      lVar11 = lVar11 + -1;
    } while (plVar12 != (node_ptr)pCVar1);
    if (lVar11 != 0) {
      uVar13 = *(int *)&col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_[1].
                        next_ + 1;
      goto LAB_001b2aa7;
    }
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_001b2aa7:
    local_1e8 = (undefined **)((ulong)local_1e8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&container,(long)(int)uVar13,(bool *)&local_1e8,(allocator_type *)&local_218);
    for (plVar12 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
        (plVar12 != (node_ptr)pCVar1 && (uVar2 = *(uint *)&plVar12[1].next_, uVar2 < uVar13));
        plVar12 = plVar12->next_) {
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p[uVar2 >> 6] =
           container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1_01.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff) +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar10 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar10 = false;
  }
  local_240 = (undefined **)CONCAT71(local_240._1_7_,bVar10);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_218 = "col.get_content(veccont.size()) == veccont";
  local_210 = "";
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e388;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_1d0 = &local_218;
  boost::test_tools::tt_detail::report_assertion(&local_240,&local_1e8,&local_100,0x29c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_230);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x29d);
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_0020e440;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_200 = -1;
  plVar12 = (node_ptr)pCVar1;
  do {
    plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_200 = local_200 + 1;
  } while (plVar12 != (node_ptr)pCVar1);
  local_26c = 3;
  local_218 = (char *)CONCAT71(local_218._1_7_,local_200 == 3);
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1d0c9c;
  local_178 = "";
  local_1f0 = &local_200;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0020e400;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x216120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_1f0;
  local_1f8 = &local_26c;
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e6c0;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = (char **)&local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_240,&local_180,0x29d,1,2,2,"col.size()",&container,"3",&local_1e8);
  boost::detail::shared_count::~shared_count(&sStack_208);
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&col;
  plVar12 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar12 != (node_ptr)pCVar1) {
    plVar14 = plVar12->next_;
    plVar12->next_ = (node_ptr)0x0;
    plVar12->prev_ = (node_ptr)0x0;
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
    ::Delete_disposer::operator()((Delete_disposer *)&container,(Entry *)&plVar12[-1].prev_);
    plVar12 = plVar14;
  }
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar1;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar1;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,0,0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x2a1);
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    lVar11 = 1;
    plVar12 = (node_ptr)pCVar1;
    do {
      plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
      lVar11 = lVar11 + -1;
    } while (plVar12 != (node_ptr)pCVar1);
    if (lVar11 == 0) {
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p._0_4_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p._4_4_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._12_4_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      goto LAB_001b2ecc;
    }
    uVar13 = *(int *)&col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_[1].
                      next_ + 1;
  }
  local_1e8 = (undefined **)((ulong)local_1e8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&container,(long)(int)uVar13,(bool *)&local_1e8,(allocator_type *)&local_218);
  for (plVar12 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
      (plVar12 != (node_ptr)pCVar1 && (uVar2 = *(uint *)&plVar12[1].next_, uVar2 < uVar13));
      plVar12 = plVar12->next_) {
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[uVar2 >> 6] =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
  }
LAB_001b2ecc:
  __last1_02.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1_02.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff) +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar10 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar10 = false;
  }
  local_240 = (undefined **)CONCAT71(local_240._1_7_,bVar10);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_218 = "col.get_content(veccont.size()) == veccont";
  local_210 = "";
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e388;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_1d0 = &local_218;
  boost::test_tools::tt_detail::report_assertion(&local_240,&local_1e8,&local_150,0x2a1,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_230);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x2a2);
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_0020e440;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  lVar11 = 1;
  plVar12 = (node_ptr)pCVar1;
  do {
    plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
    lVar11 = lVar11 + -1;
  } while (plVar12 != (node_ptr)pCVar1);
  local_200 = -lVar11;
  local_26c = 0;
  local_218 = (char *)CONCAT71(local_218._1_7_,lVar11 == 0);
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1d0c9c;
  local_178 = "";
  local_1f0 = &local_200;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0020e400;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x216120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_1f0;
  local_1f8 = &local_26c;
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0020e6c0;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = (char **)&local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_240,&local_180,0x2a2,1,2,2,"col.size()",&container,"0",&local_1e8);
  boost::detail::shared_count::~shared_count(&sStack_208);
  if (permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&col;
  plVar12 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  plVar14 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  plVar3 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
  puVar7 = permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppuVar9 = local_180;
  while (permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = puVar7,
        permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar8, local_180 = ppuVar9, plVar12 != (node_ptr)pCVar1
        ) {
    plVar4 = plVar12->next_;
    plVar12->next_ = (node_ptr)0x0;
    plVar12->prev_ = (node_ptr)0x0;
    col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = plVar14;
    col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = plVar3;
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
    ::Delete_disposer::operator()((Delete_disposer *)&container,(Entry *)&plVar12[-1].prev_);
    plVar12 = plVar4;
    plVar14 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    plVar3 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    puVar7 = permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppuVar9 = local_180;
  }
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  if (veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void column_test_base_boundary_z2_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings;

  Column col(std::vector<unsigned int>{0, 1, 2, 5, 6}, &settings);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {1, 0, 1, 0, 1, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {1, 0, 0, 0, 1, 1, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}